

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O3

void __thiscall duckdb::SimpleBufferedData::UnblockSinks(SimpleBufferedData *this)

{
  mutex *__mutex;
  int iVar1;
  _Elt_pointer this_00;
  shared_ptr<duckdb::ClientContext,_true> cc;
  weak_ptr<duckdb::ClientContext,_true> local_28;
  
  weak_ptr<duckdb::ClientContext,_true>::lock(&local_28);
  if ((local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     ((this->buffered_count).super___atomic_base<unsigned_long>._M_i < this->buffer_size)) {
    __mutex = &(this->super_BufferedData).glock;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      ::std::__throw_system_error(iVar1);
    }
    this_00 = (this->blocked_sinks).c.
              super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->blocked_sinks).c.
        super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != this_00) {
      do {
        if (this->buffer_size <= (this->buffered_count).super___atomic_base<unsigned_long>._M_i)
        break;
        InterruptState::Callback(this_00);
        ::std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::pop_front
                  (&(this->blocked_sinks).c);
        this_00 = (this->blocked_sinks).c.
                  super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while ((this->blocked_sinks).c.
               super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur != this_00);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if (local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void SimpleBufferedData::UnblockSinks() {
	auto cc = context.lock();
	if (!cc) {
		return;
	}
	(void)cc;

	if (buffered_count >= BufferSize()) {
		return;
	}
	// Reschedule enough blocked sinks to populate the buffer
	lock_guard<mutex> lock(glock);
	while (!blocked_sinks.empty()) {
		auto &blocked_sink = blocked_sinks.front();
		if (buffered_count >= BufferSize()) {
			// We have unblocked enough sinks already
			break;
		}
		blocked_sink.Callback();
		blocked_sinks.pop();
	}
}